

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Stress::LongShaderTests::init(LongShaderTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  ShaderType SVar1;
  char *pcVar2;
  LongShaderCompileStressCase *this_00;
  char *desc_00;
  undefined1 local_188 [8];
  LongShaderSpec caseSpec;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string desc;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string name;
  uint local_38;
  deUint32 flags;
  deUint32 opCount;
  ShaderType shaderType;
  int shaderTypeInt;
  int caseNdx;
  deUint32 caseOpCounts [4];
  deUint32 requireLinkOkMaxOps;
  LongShaderTests *this_local;
  
  caseOpCounts[3] = 1000;
  _shaderTypeInt = 0x3e800000064;
  caseOpCounts[0] = 10000;
  caseOpCounts[1] = 100000;
  shaderType = SHADERTYPE_VERTEX;
  SVar1 = 10000;
  while ((int)shaderType < 4) {
    for (opCount = 0; (int)opCount < 2; opCount = opCount + 1) {
      flags = (deUint32)(opCount != 0);
      local_38 = (&shaderTypeInt)[(int)shaderType];
      name.field_2._12_4_ = ZEXT14(local_38 < 0x3e9);
      de::toString<unsigned_int>(&local_a0,&local_38);
      std::operator+(&local_80,&local_a0,"_operations_");
      pcVar2 = glu::getShaderTypeName(flags);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_80,pcVar2);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Compile ",&local_151)
      ;
      pcVar2 = glu::getShaderTypeName(flags);
      std::operator+(&local_130,&local_150,pcVar2);
      std::operator+(&local_110,&local_130," shader with ");
      de::toString<unsigned_int>((string *)&caseSpec.variablesPerBlock,&local_38);
      std::operator+(&local_f0,&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &caseSpec.variablesPerBlock);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_f0," operations");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&caseSpec.variablesPerBlock);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      Stress::anon_unknown_0::LongShaderSpec::LongShaderSpec
                ((LongShaderSpec *)local_188,flags,local_38);
      this_00 = (LongShaderCompileStressCase *)operator_new(0x120);
      context = (this->super_TestCaseGroup).m_context;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      desc_00 = (char *)std::__cxx11::string::c_str();
      LongShaderCompileStressCase::LongShaderCompileStressCase
                (this_00,context,pcVar2,desc_00,(LongShaderSpec *)local_188,name.field_2._12_4_);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)local_60);
    }
    shaderType = shaderType + SHADERTYPE_FRAGMENT;
    SVar1 = shaderType;
  }
  return SVar1;
}

Assistant:

void LongShaderTests::init (void)
{
	const deUint32	requireLinkOkMaxOps	= 1000;

	const deUint32	caseOpCounts[] =
	{
		100,
		1000,
		10000,
		100000
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(caseOpCounts); caseNdx++)
	{
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType		= (shaderTypeInt == 0) ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT;
			const deUint32			opCount			= caseOpCounts[caseNdx];
			const deUint32			flags			= (opCount <= requireLinkOkMaxOps) ? CASE_REQUIRE_LINK_STATUS_OK : 0;

			const std::string		name			= de::toString(opCount) + "_operations_" + glu::getShaderTypeName(shaderType);
			const std::string		desc			= std::string("Compile ") + glu::getShaderTypeName(shaderType) + " shader with " + de::toString(opCount) + " operations";

			LongShaderSpec			caseSpec		(shaderType, opCount);

			addChild(new LongShaderCompileStressCase(m_context, name.c_str(), desc.c_str(), caseSpec, flags));
		}
	}
}